

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O1

void __thiscall
MemoryLeakDetector::ConstructMemoryLeakReport(MemoryLeakDetector *this,MemLeakPeriod period)

{
  MemoryLeakDetectorNode *leak;
  
  leak = MemoryLeakDetectorTable::getFirstLeak(&this->memoryTable_,period);
  (this->outputBuffer_).giveWarningOnUsingMalloc_ = false;
  (this->outputBuffer_).total_leaks_ = 0;
  (this->outputBuffer_).outputBuffer_.write_limit_ = 0xe88;
  for (; leak != (MemoryLeakDetectorNode *)0x0;
      leak = MemoryLeakDetectorTable::getNextLeak(&this->memoryTable_,leak,period)) {
    MemoryLeakOutputStringBuffer::reportMemoryLeak(&this->outputBuffer_,leak);
  }
  MemoryLeakOutputStringBuffer::stopMemoryLeakReporting(&this->outputBuffer_);
  return;
}

Assistant:

void MemoryLeakDetector::ConstructMemoryLeakReport(MemLeakPeriod period)
{
    MemoryLeakDetectorNode* leak = memoryTable_.getFirstLeak(period);

    outputBuffer_.startMemoryLeakReporting();

    while (leak) {
        outputBuffer_.reportMemoryLeak(leak);
        leak = memoryTable_.getNextLeak(leak, period);
    }

    outputBuffer_.stopMemoryLeakReporting();
}